

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,BayesianGameWithClusterInfo *o)

{
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *this_00;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *this_01;
  QHybrid *pQVar1;
  double dVar2;
  const_reference ppvVar3;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *this_02;
  reference ppvVar4;
  TypeCluster *this_03;
  reference ppTVar5;
  uint uVar6;
  ulong __n;
  uint uVar7;
  ulong __n_00;
  undefined1 auVar8 [64];
  allocator_type local_69;
  BayesianGameWithClusterInfo *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  BayesianGameWithClusterInfo *local_58;
  value_type local_50;
  _Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  local_48;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,&o->super_BayesianGameForDecPOMDPStage);
  this_00 = &this->_m_typeLists;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005d85e8;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005d8638
  ;
  (this->_m_pBG).px = (element_type *)0x0;
  (this->_m_pBG).pn.pi_ = (sp_counted_base *)0x0;
  local_68 = (BayesianGameWithClusterInfo *)&this->_m_pBGJPol;
  auVar8 = ZEXT464(0) << 0x40;
  (this->_m_pBGJPol).px = (element_type *)SUB168(auVar8._0_16_,0);
  (this->_m_pBGJPol).pn = (shared_count)SUB168(auVar8._0_16_,8);
  this->_m_jaohReps = (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar8._16_24_;
  this->_m_typeLists =
       (vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
        )auVar8._40_24_;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(&this->_m_pBG,&o->_m_pBG);
  pQVar1 = o->_m_qHybrid;
  this->_m_qJB = o->_m_qJB;
  this->_m_qHybrid = pQVar1;
  boost::shared_ptr<const_JointPolicyDiscretePure>::operator=
            ((shared_ptr<const_JointPolicyDiscretePure> *)local_68,&o->_m_pBGJPol);
  local_60 = &this->_m_jaohReps;
  local_58 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->_m_jaohReps,&o->_m_jaohReps);
  this->_m_clusterAlgorithm = o->_m_clusterAlgorithm;
  dVar2 = o->_m_thresholdPjaoh;
  this->_m_thresholdJB = o->_m_thresholdJB;
  this->_m_thresholdPjaoh = dVar2;
  local_50 = (value_type)0x0;
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)&local_48,
           (long)(o->_m_typeLists).
                 super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(o->_m_typeLists).
                 super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,&local_50,&local_69);
  this_01 = &o->_m_typeLists;
  local_68 = o;
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::_M_move_assign(this_00,&local_48);
  std::
  _Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::~_Vector_base(&local_48);
  for (uVar6 = 0; __n = (ulong)uVar6,
      (long)(local_68->_m_typeLists).
            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_68->_m_typeLists).
            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != __n; uVar6 = uVar6 + 1) {
    ppvVar3 = std::
              vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
              ::at(this_01,__n);
    if (*ppvVar3 != (value_type)0x0) {
      this_02 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)operator_new(0x18);
      ppvVar3 = std::
                vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ::at(this_01,__n);
      std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector(this_02,*ppvVar3);
      ppvVar4 = std::
                vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ::at(this_00,__n);
      *ppvVar4 = this_02;
      uVar7 = 0;
      while( true ) {
        ppvVar3 = std::
                  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ::at(this_01,__n);
        __n_00 = (ulong)uVar7;
        if ((long)((*ppvVar3)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)((*ppvVar3)->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3 == __n_00) break;
        this_03 = (TypeCluster *)operator_new(0x38);
        ppvVar3 = std::
                  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ::at(this_01,__n);
        ppTVar5 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at(*ppvVar3,__n_00);
        TypeCluster::TypeCluster(this_03,*ppTVar5);
        ppvVar4 = std::
                  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ::at(this_00,__n);
        ppTVar5 = std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::at(*ppvVar4,__n_00);
        *ppTVar5 = this_03;
        uVar7 = uVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(const BayesianGameWithClusterInfo& o) :
        BayesianGameForDecPOMDPStage( o )
{
    _m_pBG = o._m_pBG;
    _m_qJB = o._m_qJB;
    _m_qHybrid = o._m_qHybrid;
    _m_pBGJPol = o._m_pBGJPol;
    _m_jaohReps = o._m_jaohReps;
    _m_clusterAlgorithm = o._m_clusterAlgorithm;
    _m_thresholdJB = o._m_thresholdJB;
    _m_thresholdPjaoh = o._m_thresholdPjaoh;
    _m_typeLists= std::vector< TypeClusterList* > (o._m_typeLists.size(),0);
    for(Index k=0;k!=o._m_typeLists.size();++k)
    {
        if(o._m_typeLists.at(k))
        {
            _m_typeLists.at(k)=new TypeClusterList(*o._m_typeLists.at(k));
            for(Index j=0;j!=o._m_typeLists.at(k)->size();++j)
                _m_typeLists.at(k)->at(j)=new TypeCluster(*o._m_typeLists.at(k)->at(j));
        }
    }
}